

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O3

FT_Error TT_Load_Simple_Glyph(TT_Loader load)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  FT_GlyphSlot pFVar4;
  TT_ExecContext pTVar5;
  FT_Byte *__dest;
  ushort uVar6;
  FT_Error FVar7;
  ushort *puVar8;
  ushort *puVar9;
  FT_Vector *pFVar10;
  FT_Vector *pFVar11;
  ushort *puVar12;
  ushort uVar13;
  long lVar14;
  byte *__s;
  ulong uVar15;
  TT_Loader pTVar16;
  byte *pbVar17;
  FT_UInt n_contours;
  byte *pbVar18;
  byte *pbVar19;
  byte *pbVar20;
  byte *pbVar21;
  FT_GlyphLoader loader;
  bool bVar22;
  ulong local_60;
  FT_ULong tmp;
  byte *local_50;
  byte *local_48;
  ulong local_40;
  TT_Loader local_38;
  
  loader = load->gloader;
  pbVar21 = load->cursor;
  pbVar17 = load->limit;
  sVar3 = load->n_contours;
  n_contours = (FT_UInt)sVar3;
  if (sVar3 == 0) {
    puVar8 = (ushort *)(loader->current).outline.contours;
    puVar12 = puVar8;
  }
  else {
    if ((loader->max_contours <
         (int)(loader->base).outline.n_contours + n_contours +
         (int)(loader->current).outline.n_contours) &&
       (local_38 = load, FVar7 = FT_GlyphLoader_CheckPoints(loader,0,n_contours), load = local_38,
       FVar7 != 0)) {
      return FVar7;
    }
    if (0xffe < sVar3) {
      return 0x14;
    }
    puVar8 = (ushort *)(loader->current).outline.contours;
    puVar12 = puVar8 + (int)n_contours;
  }
  if (pbVar17 < pbVar21 + (long)(int)n_contours * 2 + 2) {
    return 0x14;
  }
  bVar1 = *pbVar21;
  uVar6 = CONCAT11(bVar1,pbVar21[1]);
  if (0 < sVar3) {
    *puVar8 = uVar6;
  }
  if (-1 < (short)((ushort)bVar1 << 8)) {
    pbVar18 = pbVar21 + 4;
    pbVar21 = pbVar17 + (-4 - (long)pbVar21);
    while (puVar9 = puVar8 + 1, puVar9 < puVar12) {
      uVar13 = *(ushort *)(pbVar18 + -2) << 8 | *(ushort *)(pbVar18 + -2) >> 8;
      *puVar9 = uVar13;
      pbVar18 = pbVar18 + 2;
      pbVar21 = pbVar21 + -2;
      bVar22 = (short)uVar13 <= (short)uVar6;
      puVar8 = puVar9;
      uVar6 = uVar13;
      if (bVar22) {
        return 0x14;
      }
    }
    if (sVar3 < 1) {
      local_38 = (TT_Loader)0x0;
    }
    else {
      if ((short)*puVar8 < -1) {
        return 0x14;
      }
      local_38 = (TT_Loader)(ulong)((int)(short)*puVar8 + 1);
    }
    if ((loader->max_points <
         (uint)((int)(loader->base).outline.n_points + (int)local_38 + 4 +
               (int)(loader->current).outline.n_points)) &&
       (tmp = (FT_ULong)loader, FVar7 = FT_GlyphLoader_CheckPoints(loader,(int)local_38 + 4,0),
       loader = (FT_GlyphLoader)tmp, FVar7 != 0)) {
      return FVar7;
    }
    pFVar4 = load->glyph;
    pFVar4->control_data = (void *)0x0;
    pFVar4->control_len = 0;
    if (pbVar17 < pbVar18) {
      return 0x14;
    }
    uVar6 = *(ushort *)(pbVar18 + -2) << 8 | *(ushort *)(pbVar18 + -2) >> 8;
    uVar15 = (ulong)uVar6;
    pTVar16 = local_38;
    if ((load->load_flags & 2) == 0) {
      if ((long)pbVar21 < (long)uVar15) {
        return 0x16;
      }
      local_48 = (byte *)CONCAT62(local_48._2_6_,uVar6);
      pTVar5 = load->exec;
      local_60 = (ulong)pTVar5->glyphSize;
      local_50 = pbVar17;
      FVar7 = Update_Max(pTVar5->memory,&local_60,1,&pTVar5->glyphIns,uVar15);
      pTVar5 = load->exec;
      pTVar5->glyphSize = (uint)(ushort)local_60;
      if (FVar7 != 0) {
        return FVar7;
      }
      pFVar4 = load->glyph;
      pFVar4->control_len = uVar15;
      __dest = pTVar5->glyphIns;
      pFVar4->control_data = __dest;
      pTVar16 = local_38;
      pbVar17 = local_50;
      if ((short)local_48 != 0) {
        memcpy(__dest,pbVar18,uVar15);
        pTVar16 = local_38;
        pbVar17 = local_50;
      }
    }
    pbVar18 = pbVar18 + uVar15;
    local_38 = pTVar16;
    if ((int)pTVar16 == 0) {
      if (pbVar17 < pbVar18) {
        return 0x14;
      }
    }
    else {
      pbVar20 = (byte *)(loader->current).outline.tags;
      local_40 = (ulong)pTVar16 & 0xffffffff;
      pbVar21 = pbVar20 + local_40;
      pbVar19 = pbVar18;
      tmp = (FT_ULong)loader;
      local_48 = pbVar21;
      do {
        pbVar18 = pbVar19 + 1;
        if (pbVar17 < pbVar18) {
          return 0x14;
        }
        bVar1 = *pbVar19;
        __s = pbVar20 + 1;
        *pbVar20 = bVar1;
        if ((bVar1 & 8) != 0) {
          pbVar19 = pbVar19 + 2;
          if (pbVar17 < pbVar19) {
            return 0x14;
          }
          local_50 = (byte *)(ulong)*pbVar18;
          if (pbVar21 < __s + (long)local_50) {
            return 0x14;
          }
          pbVar18 = pbVar19;
          if (local_50 != (byte *)0x0) {
            memset(__s,(uint)bVar1,(size_t)local_50);
            __s = pbVar20 + (ulong)((int)local_50 - 1U & 0xff) + 2;
            pbVar21 = local_48;
            pTVar16 = local_38;
            loader = (FT_GlyphLoader)tmp;
          }
        }
        pbVar19 = pbVar18;
        pbVar20 = __s;
      } while (__s < pbVar21);
      if (pbVar17 < pbVar18) {
        return 0x14;
      }
      if ((int)pTVar16 != 0) {
        pFVar10 = (loader->current).outline.points;
        pFVar11 = pFVar10 + local_40;
        pbVar21 = (byte *)(loader->current).outline.tags;
        lVar14 = 0;
        pbVar20 = pbVar18;
        do {
          bVar1 = *pbVar21;
          if ((bVar1 & 2) == 0) {
            if ((bVar1 & 0x10) == 0) {
              if (pbVar17 < pbVar20 + 2) {
                return 0x14;
              }
              uVar15 = (long)(short)((ushort)*pbVar20 << 8) | (ulong)pbVar20[1];
              pbVar18 = pbVar20 + 2;
            }
            else {
              uVar15 = 0;
              pbVar18 = pbVar20;
            }
          }
          else {
            pbVar18 = pbVar20 + 1;
            if (pbVar17 < pbVar18) {
              return 0x14;
            }
            uVar15 = -(ulong)*pbVar20;
            if ((bVar1 & 0x10) != 0) {
              uVar15 = (ulong)*pbVar20;
            }
          }
          lVar14 = lVar14 + uVar15;
          pFVar10->x = lVar14;
          *pbVar21 = bVar1 & 0xed;
          pFVar10 = pFVar10 + 1;
          pbVar21 = pbVar21 + 1;
          pbVar20 = pbVar18;
        } while (pFVar10 < pFVar11);
        bVar22 = (int)local_38 != 0;
        if (bVar22) {
          pFVar11 = (loader->current).outline.points;
          pFVar10 = pFVar11 + local_40;
          pbVar21 = (byte *)(loader->current).outline.tags;
          lVar14 = 0;
          do {
            bVar1 = *pbVar21;
            if ((bVar1 & 4) == 0) {
              if ((bVar1 & 0x20) == 0) {
                if (pbVar17 < pbVar18 + 2) {
                  return 0x14;
                }
                uVar15 = (long)(short)((ushort)*pbVar18 << 8) | (ulong)pbVar18[1];
                pbVar18 = pbVar18 + 2;
              }
              else {
                uVar15 = 0;
              }
            }
            else {
              pbVar20 = pbVar18 + 1;
              if (pbVar17 < pbVar20) {
                return 0x14;
              }
              bVar2 = *pbVar18;
              uVar15 = -(ulong)bVar2;
              pbVar18 = pbVar20;
              if ((bVar1 & 0x20) != 0) {
                uVar15 = (ulong)bVar2;
              }
            }
            lVar14 = lVar14 + uVar15;
            pFVar11->y = lVar14;
            *pbVar21 = bVar1 & 1;
            pFVar11 = pFVar11 + 1;
            pbVar21 = pbVar21 + 1;
          } while (pFVar11 < pFVar10);
        }
      }
    }
    (loader->current).outline.n_points = (short)local_38;
    (loader->current).outline.n_contours = sVar3;
    load->cursor = pbVar18;
    return 0;
  }
  return 0x14;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  TT_Load_Simple_Glyph( TT_Loader  load )
  {
    FT_Error        error;
    FT_Byte*        p          = load->cursor;
    FT_Byte*        limit      = load->limit;
    FT_GlyphLoader  gloader    = load->gloader;
    FT_Int          n_contours = load->n_contours;
    FT_Outline*     outline;
    FT_UShort       n_ins;
    FT_Int          n_points;

    FT_Byte         *flag, *flag_limit;
    FT_Byte         c, count;
    FT_Vector       *vec, *vec_limit;
    FT_Pos          x;
    FT_Short        *cont, *cont_limit, prev_cont;
    FT_Int          xy_size = 0;


    /* check that we can add the contours to the glyph */
    error = FT_GLYPHLOADER_CHECK_POINTS( gloader, 0, n_contours );
    if ( error )
      goto Fail;

    /* reading the contours' endpoints & number of points */
    cont       = gloader->current.outline.contours;
    cont_limit = cont + n_contours;

    /* check space for contours array + instructions count */
    if ( n_contours >= 0xFFF || p + ( n_contours + 1 ) * 2 > limit )
      goto Invalid_Outline;

    prev_cont = FT_NEXT_SHORT( p );

    if ( n_contours > 0 )
      cont[0] = prev_cont;

    if ( prev_cont < 0 )
      goto Invalid_Outline;

    for ( cont++; cont < cont_limit; cont++ )
    {
      cont[0] = FT_NEXT_SHORT( p );
      if ( cont[0] <= prev_cont )
      {
        /* unordered contours: this is invalid */
        goto Invalid_Outline;
      }
      prev_cont = cont[0];
    }

    n_points = 0;
    if ( n_contours > 0 )
    {
      n_points = cont[-1] + 1;
      if ( n_points < 0 )
        goto Invalid_Outline;
    }

    /* note that we will add four phantom points later */
    error = FT_GLYPHLOADER_CHECK_POINTS( gloader, n_points + 4, 0 );
    if ( error )
      goto Fail;

    /* reading the bytecode instructions */
    load->glyph->control_len  = 0;
    load->glyph->control_data = NULL;

    if ( p + 2 > limit )
      goto Invalid_Outline;

    n_ins = FT_NEXT_USHORT( p );

    FT_TRACE5(( "  Instructions size: %u\n", n_ins ));

#ifdef TT_USE_BYTECODE_INTERPRETER

    if ( IS_HINTED( load->load_flags ) )
    {
      FT_ULong  tmp;


      /* check instructions size */
      if ( ( limit - p ) < n_ins )
      {
        FT_TRACE1(( "TT_Load_Simple_Glyph: instruction count mismatch\n" ));
        error = FT_THROW( Too_Many_Hints );
        goto Fail;
      }

      /* we don't trust `maxSizeOfInstructions' in the `maxp' table */
      /* and thus update the bytecode array size by ourselves       */

      tmp   = load->exec->glyphSize;
      error = Update_Max( load->exec->memory,
                          &tmp,
                          sizeof ( FT_Byte ),
                          (void*)&load->exec->glyphIns,
                          n_ins );

      load->exec->glyphSize = (FT_UShort)tmp;
      if ( error )
        return error;

      load->glyph->control_len  = n_ins;
      load->glyph->control_data = load->exec->glyphIns;

      if ( n_ins )
        FT_MEM_COPY( load->exec->glyphIns, p, (FT_Long)n_ins );
    }

#endif /* TT_USE_BYTECODE_INTERPRETER */

    p += n_ins;

    outline = &gloader->current.outline;

    /* reading the point tags */
    flag       = (FT_Byte*)outline->tags;
    flag_limit = flag + n_points;

    FT_ASSERT( flag );

    while ( flag < flag_limit )
    {
      if ( p + 1 > limit )
        goto Invalid_Outline;

      *flag++ = c = FT_NEXT_BYTE( p );
      if ( c & 8 )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        count = FT_NEXT_BYTE( p );
        if ( flag + (FT_Int)count > flag_limit )
          goto Invalid_Outline;

        for ( ; count > 0; count-- )
          *flag++ = c;
      }
    }

    /* reading the X coordinates */

    vec       = outline->points;
    vec_limit = vec + n_points;
    flag      = (FT_Byte*)outline->tags;
    x         = 0;

    if ( p + xy_size > limit )
      goto Invalid_Outline;

    for ( ; vec < vec_limit; vec++, flag++ )
    {
      FT_Pos   y = 0;
      FT_Byte  f = *flag;


      if ( f & 2 )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        y = (FT_Pos)FT_NEXT_BYTE( p );
        if ( ( f & 16 ) == 0 )
          y = -y;
      }
      else if ( ( f & 16 ) == 0 )
      {
        if ( p + 2 > limit )
          goto Invalid_Outline;

        y = (FT_Pos)FT_NEXT_SHORT( p );
      }

      x     += y;
      vec->x = x;
      /* the cast is for stupid compilers */
      *flag  = (FT_Byte)( f & ~( 2 | 16 ) );
    }

    /* reading the Y coordinates */

    vec       = gloader->current.outline.points;
    vec_limit = vec + n_points;
    flag      = (FT_Byte*)outline->tags;
    x         = 0;

    for ( ; vec < vec_limit; vec++, flag++ )
    {
      FT_Pos   y = 0;
      FT_Byte  f = *flag;


      if ( f & 4 )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        y = (FT_Pos)FT_NEXT_BYTE( p );
        if ( ( f & 32 ) == 0 )
          y = -y;
      }
      else if ( ( f & 32 ) == 0 )
      {
        if ( p + 2 > limit )
          goto Invalid_Outline;

        y = (FT_Pos)FT_NEXT_SHORT( p );
      }

      x     += y;
      vec->y = x;
      /* the cast is for stupid compilers */
      *flag  = (FT_Byte)( f & FT_CURVE_TAG_ON );
    }

    outline->n_points   = (FT_Short)n_points;
    outline->n_contours = (FT_Short)n_contours;

    load->cursor = p;

  Fail:
    return error;

  Invalid_Outline:
    error = FT_THROW( Invalid_Outline );
    goto Fail;
  }